

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::alert_manager::
emplace_alert<libtorrent::block_finished_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::digest32<160l>,int_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
          (alert_manager *this,torrent_handle *args,basic_endpoint<boost::asio::ip::tcp> *args_1,
          digest32<160L> *args_2,int *args_3,
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *args_4)

{
  byte *pbVar1;
  int iVar2;
  type a;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> local_40;
  
  local_40._M_owns = false;
  local_40._M_device = &this->m_mutex;
  ::std::unique_lock<std::recursive_mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar2 = this->m_generation;
  if ((this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems
      [iVar2].m_num_items < this->m_queue_size_limit) {
    a = heterogeneous_queue<libtorrent::alert>::
        emplace_back<libtorrent::block_finished_alert,libtorrent::aux::stack_allocator&,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::digest32<160l>,int_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                  ((this->m_alerts).
                   super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems +
                   iVar2,(this->m_allocations).super_array<libtorrent::aux::stack_allocator,_2UL>.
                         _M_elems + iVar2,args,args_1,args_2,args_3,args_4);
    maybe_notify(this,(alert *)a);
  }
  else {
    pbVar1 = (byte *)((long)(this->m_dropped).super__Base_bitset<2UL>._M_w + 3);
    *pbVar1 = *pbVar1 | 0x40;
  }
  ::std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void emplace_alert(Args&&... args) try
		{
			std::unique_lock<std::recursive_mutex> lock(m_mutex);

			heterogeneous_queue<alert>& queue = m_alerts[m_generation];

			// don't add more than this number of alerts, unless it's a
			// high priority alert, in which case we try harder to deliver it
			// for high priority alerts, double the upper limit
			if (queue.size() / (1 + static_cast<int>(T::priority)) >= m_queue_size_limit)
			{
				// record that we dropped an alert of this type
				m_dropped.set(T::alert_type);
				return;
			}

			T& alert = queue.emplace_back<T>(
				m_allocations[m_generation], std::forward<Args>(args)...);

			maybe_notify(&alert);
		}
		catch (std::bad_alloc const&)
		{
			// record that we dropped an alert of this type
			std::unique_lock<std::recursive_mutex> lock(m_mutex);
			m_dropped.set(T::alert_type);
		}